

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

ActionResultHolder<ot::commissioner::Error> *
testing::internal::ActionResultHolder<ot::commissioner::Error>::
PerformDefaultAction<ot::commissioner::Error(std::__cxx11::string_const&,std::__cxx11::string_const&)>
          (FunctionMocker<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           *func_mocker,ArgumentTuple *args,string *call_description)

{
  ActionResultHolder<ot::commissioner::Error> *pAVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Result local_50;
  
  pAVar1 = (ActionResultHolder<ot::commissioner::Error> *)operator_new(0x30);
  FunctionMocker<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::PerformDefaultAction(&local_50,func_mocker,args,call_description);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.mMessage._M_dataplus._M_p == &local_50.mMessage.field_2) {
    local_60._8_8_ = local_50.mMessage.field_2._8_8_;
    local_70 = &local_60;
  }
  else {
    local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_50.mMessage._M_dataplus._M_p;
  }
  local_60._M_allocated_capacity._1_7_ = local_50.mMessage.field_2._M_allocated_capacity._1_7_;
  local_60._M_local_buf[0] = local_50.mMessage.field_2._M_local_buf[0];
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__ActionResultHolder_0039fbf8;
  (pAVar1->result_).value_.mCode = local_50.mCode;
  paVar2 = &(pAVar1->result_).value_.mMessage.field_2;
  (pAVar1->result_).value_.mMessage._M_dataplus._M_p = (pointer)paVar2;
  if (local_70 == &local_60) {
    paVar2->_M_allocated_capacity = local_60._M_allocated_capacity;
    *(undefined8 *)((long)&(pAVar1->result_).value_.mMessage.field_2 + 8) = local_60._8_8_;
  }
  else {
    (pAVar1->result_).value_.mMessage._M_dataplus._M_p = (pointer)local_70;
    (pAVar1->result_).value_.mMessage.field_2._M_allocated_capacity = local_60._M_allocated_capacity
    ;
  }
  (pAVar1->result_).value_.mMessage._M_string_length = local_50.mMessage._M_string_length;
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMocker<F>* func_mocker,
      typename Function<F>::ArgumentTuple&& args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        std::move(args), call_description)));
  }